

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::dminus(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,4,"D-");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,3);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00,2);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)((ulong)uVar3 - (ulong)uVar1));
  ForthStack<unsigned_int>::setTop
            (this_00,0,((int)((ulong)uVar3 - (ulong)uVar1 >> 0x20) - uVar2) + uVar4);
  return;
}

Assistant:

void dminus(){
			REQUIRE_DSTACK_DEPTH(4, "D-");
			DCell d2(dStack.getTop(1), dStack.getTop());
			DCell d1(dStack.getTop(3), dStack.getTop(2));
			d1.data_.Dcells = d1.data_.Dcells-d2.data_.Dcells;
			dStack.pop();dStack.pop();
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}